

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  Index IVar2;
  Enum EVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  bool local_49;
  bool all_ref_func;
  Index table_index;
  uint8_t flags;
  Module *module_local;
  ElemSegment *this_local;
  
  all_ref_func = false;
  SVar1 = this->kind;
  if (SVar1 == Active) {
    IVar2 = Module::GetTableIndex(module,&this->table_var);
    EVar3 = Type::operator_cast_to_Enum(&this->elem_type);
    if ((EVar3 != FuncRef) || (IVar2 != 0)) {
      all_ref_func = true;
    }
  }
  else if (SVar1 == Passive) {
    all_ref_func = true;
  }
  else if (SVar1 == Declared) {
    all_ref_func = true;
  }
  EVar3 = Type::operator_cast_to_Enum(&this->elem_type);
  local_49 = false;
  if (EVar3 == FuncRef) {
    cVar4 = std::
            vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
            ::begin(&this->elem_exprs);
    cVar5 = std::
            vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
            ::end(&this->elem_exprs);
    local_49 = std::
               all_of<__gnu_cxx::__normal_iterator<wabt::intrusive_list<wabt::Expr>const*,std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>>,wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0>
                         (cVar4._M_current,cVar5._M_current);
  }
  if (local_49 == false) {
    all_ref_func = (bool)(all_ref_func | 4);
  }
  return all_ref_func;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}